

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O2

void __thiscall NJamSpell::TSpellCorrector::Inserts(TSpellCorrector *this,wstring *w,TWords *result)

{
  unordered_set<wchar_t,_std::hash<wchar_t>,_std::equal_to<wchar_t>,_std::allocator<wchar_t>_>
  *puVar1;
  ulong uVar2;
  __node_base *p_Var3;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_c8;
  undefined1 local_a8 [8];
  wstring s;
  undefined1 local_68 [8];
  TWord c;
  
  for (uVar2 = 0; uVar2 < w->_M_string_length + 1; uVar2 = uVar2 + 1) {
    puVar1 = TLangModel::GetAlphabet(&this->LangModel);
    p_Var3 = &(puVar1->_M_h)._M_before_begin;
    while (p_Var3 = p_Var3->_M_nxt, p_Var3 != (__node_base *)0x0) {
      std::__cxx11::wstring::substr((ulong)(&s.field_2._M_allocated_capacity + 1),(ulong)w);
      std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     local_68,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)(&s.field_2._M_allocated_capacity + 1),
                     (wchar_t)*(size_type *)(p_Var3 + 1));
      std::__cxx11::wstring::substr((ulong)&local_c8,(ulong)w);
      std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     local_a8,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                               *)local_68,&local_c8);
      std::__cxx11::wstring::~wstring((wstring *)&local_c8);
      std::__cxx11::wstring::~wstring((wstring *)local_68);
      std::__cxx11::wstring::~wstring((wstring *)((long)&s.field_2 + 8));
      _local_68 = TLangModel::GetWord(&this->LangModel,
                                      (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                                       *)local_a8);
      if (local_68._8_8_ != 0 && local_68 != (wchar_t *)0x0) {
        std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::push_back
                  (result,(value_type *)local_68);
      }
      std::__cxx11::wstring::~wstring((wstring *)local_a8);
    }
  }
  return;
}

Assistant:

void TSpellCorrector::Inserts(const std::wstring& w, TWords& result) const {
    for (size_t i = 0; i < w.size() + 1; ++i) {
        for (auto&& ch: LangModel.GetAlphabet()) {
            std::wstring s = w.substr(0, i) + ch + w.substr(i);
            TWord c = LangModel.GetWord(s);
            if (c.Ptr && c.Len) {
                result.push_back(c);
            }
        }
    }
}